

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O1

MultisamplePixelBufferAccess * __thiscall
sglr::ReferenceContext::getDrawDepthbuffer
          (MultisamplePixelBufferAccess *__return_storage_ptr__,ReferenceContext *this)

{
  PixelBufferAccess PStack_38;
  
  if (this->m_drawFramebufferBinding == (Framebuffer *)0x0) {
    (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_format =
         (this->m_defaultDepthbuffer).m_access.super_ConstPixelBufferAccess.m_format;
    (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_size.m_data[2] =
         (this->m_defaultDepthbuffer).m_access.super_ConstPixelBufferAccess.m_size.m_data[2];
    *(undefined8 *)(__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_size.m_data =
         *(undefined8 *)
          (this->m_defaultDepthbuffer).m_access.super_ConstPixelBufferAccess.m_size.m_data;
    *(undefined8 *)(__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_pitch.m_data =
         *(undefined8 *)
          (this->m_defaultDepthbuffer).m_access.super_ConstPixelBufferAccess.m_pitch.m_data;
    (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_pitch.m_data[2] =
         (this->m_defaultDepthbuffer).m_access.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    (__return_storage_ptr__->m_access).super_ConstPixelBufferAccess.m_data =
         (this->m_defaultDepthbuffer).m_access.super_ConstPixelBufferAccess.m_data;
  }
  else {
    getFboAttachment(&PStack_38,this,this->m_drawFramebufferBinding,ATTACHMENTPOINT_DEPTH);
    rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(__return_storage_ptr__,&PStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

rr::MultisamplePixelBufferAccess	getDrawDepthbuffer		(void)	{ return (m_drawFramebufferBinding) ? (rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(getFboAttachment(*m_drawFramebufferBinding, rc::Framebuffer::ATTACHMENTPOINT_DEPTH)))	:	(m_defaultDepthbuffer);		}